

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

Data parseWatsonFromStream(FILE *fp)

{
  int iVar1;
  VM vm;
  Data pvVar2;
  
  vm = newFileVM(LexerA,fp);
  while( true ) {
    iVar1 = fgetc((FILE *)fp);
    if (iVar1 == -1) break;
    parseCommand(vm,(char)iVar1);
  }
  pvVar2 = pop(vm->stack);
  freeVM(vm);
  return pvVar2;
}

Assistant:

Data parseWatsonFromStream(FILE *fp) {
    VM vm = newFileVM(LexerA, fp);
    int c;
    while ((c = fgetc(fp)) != EOF)parseCommand(vm, (char) c);
    Data d = pop(vm->stack);
    freeVM(vm);
    return d;
}